

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex9.cpp
# Opt level: O2

void func_arr(void)

{
  int i;
  void *pvVar1;
  long lVar2;
  ostream *poVar3;
  int i_1;
  ulong uVar4;
  
  pvVar1 = operator_new__(400);
  for (lVar2 = 0; lVar2 != 100; lVar2 = lVar2 + 1) {
    *(int *)((long)pvVar1 + lVar2 * 4) = (int)lVar2;
  }
  std::operator<<((ostream *)&std::cout,"\nMemory addresses in array:");
  for (uVar4 = 0; uVar4 < 100; uVar4 = uVar4 + 10) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n&arr[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)uVar4);
    poVar3 = std::operator<<(poVar3,"] = ");
    std::ostream::_M_insert<void_const*>(poVar3);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  operator_delete__(pvVar1);
  return;
}

Assistant:

void func_arr()
{
	constexpr unsigned int size = 100;
	int* arr = new int[size];
	for (int i = 0; i < size; i++)
	{
		arr[i] = i;
	}
	std::cout << "\nMemory addresses in array:";
	for (int i = 0; i < size; i += 10)
	{
		std::cout << "\n&arr[" << i << "] = " << &arr[i];
	}
	std::cout << std::endl;
	delete[] arr;
}